

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O3

int compute_all_adcw(uint16_t dst,uint16_t src1,uint16_t src3)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_00000012;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  uint uVar5;
  
  uVar3 = (uint)src1;
  iVar2 = (int)CONCAT62(in_register_00000012,src3);
  bVar1 = dst <= src1;
  if (iVar2 == 0) {
    bVar1 = dst < src1;
  }
  uVar4 = (uint)CONCAT62(in_register_0000003a,dst);
  uVar5 = uVar4 - (iVar2 + uVar3);
  return (uVar5 ^ uVar3 ^ uVar4) & 0x10 | (uint)bVar1 | (uint)"\x04"[uVar4 & 0xff] |
         (~(uVar5 ^ uVar3) & (uVar3 ^ uVar4)) >> 4 & 0x800 |
         (uint)(uVar4 == 0) << 6 | uVar4 >> 8 & 0xffffff80;
}

Assistant:

static int glue(compute_all_adc, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2 = dst - src1 - src3;

    cf = (src3 ? dst <= src1 : dst < src1);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2 ^ -1) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}